

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timBox.c
# Opt level: O0

float * Tim_ManBoxDelayTable(Tim_Man_t *p,int iBox)

{
  Tim_Box_t *pTVar1;
  Tim_Box_t *pBox;
  float *pTable;
  int iBox_local;
  Tim_Man_t *p_local;
  
  pTVar1 = Tim_ManBox(p,iBox);
  if (pTVar1->iDelayTable < 0) {
    p_local = (Tim_Man_t *)0x0;
  }
  else {
    p_local = (Tim_Man_t *)Vec_PtrEntry(p->vDelayTables,pTVar1->iDelayTable);
    if ((int)*(float *)((long)&p_local->vBoxes + 4) != pTVar1->nInputs) {
      __assert_fail("(int)pTable[1] == pBox->nInputs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timBox.c"
                    ,0xf2,"float *Tim_ManBoxDelayTable(Tim_Man_t *, int)");
    }
    if ((int)*(float *)&p_local->vDelayTables != pTVar1->nOutputs) {
      __assert_fail("(int)pTable[2] == pBox->nOutputs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/tim/timBox.c"
                    ,0xf3,"float *Tim_ManBoxDelayTable(Tim_Man_t *, int)");
    }
  }
  return (float *)p_local;
}

Assistant:

float * Tim_ManBoxDelayTable( Tim_Man_t * p, int iBox )
{
    float * pTable;
    Tim_Box_t * pBox = Tim_ManBox(p, iBox);
    if ( pBox->iDelayTable < 0 )
        return NULL;
    pTable = (float *)Vec_PtrEntry( p->vDelayTables, pBox->iDelayTable );
    assert( (int)pTable[1] == pBox->nInputs );
    assert( (int)pTable[2] == pBox->nOutputs );
    return pTable;
}